

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::write_gets(Rdma *this)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long lVar7;
  size_t size;
  size_t slot;
  size_t local_38;
  unsigned_long local_30;
  
  iVar4 = this->m_nprocs;
  if (0 < iVar4) {
    puVar2 = (this->m_second_exchange).m_recv_sizes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_second_exchange).m_recv_pos.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      uVar1 = (this->m_recv_actions).m_get_buffer_offset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      uVar5 = puVar3[lVar7];
      uVar6 = puVar2[lVar7];
      if (uVar1 <= uVar6 - uVar5) {
        uVar5 = uVar5 + uVar1;
        puVar3[lVar7] = uVar5;
        uVar6 = puVar2[lVar7];
      }
      if (uVar6 != uVar5) {
        do {
          deserial<unsigned_long>(&this->m_second_exchange,(int)lVar7,&local_38);
          deserial<unsigned_long>(&this->m_second_exchange,(int)lVar7,&local_30);
          memcpy((this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[local_30],
                 (this->m_second_exchange).m_recv_bufs.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start +
                 (this->m_second_exchange).m_recv_pos.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] +
                 (this->m_second_exchange).m_recv_cap * lVar7,local_38);
          puVar2 = (this->m_second_exchange).m_recv_sizes.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (this->m_second_exchange).m_recv_pos.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_38 <= puVar2[lVar7] - puVar3[lVar7]) {
            puVar3[lVar7] = puVar3[lVar7] + local_38;
          }
        } while (puVar2[lVar7] != puVar3[lVar7]);
        iVar4 = this->m_nprocs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

void Rdma::write_gets()
{
#ifdef PROFILE
    TicToc t(TicToc::GET );
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t start = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_pop( p, start );
        while ( m_second_exchange.recv_size( p ) > 0 ) {
            size_t size, slot;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, slot);
           
            char * dst_addr = static_cast<char *>(m_local_slots[ slot ]);

            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        size_t end = m_second_exchange.recv_pos(p);
        t.add_bytes( end - start );
#endif
   }
}